

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dump2XYZ.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Snapshot *this;
  int iVar1;
  SimInfo *info;
  ForceManager *this_00;
  CompositeVisitor *this_01;
  BaseVisitor *pBVar2;
  WaterTypeVisitor *this_02;
  AtomNameVisitor *this_03;
  ZConsVisitor *this_04;
  ReplicateVisitor *this_05;
  LipidTransVisitor *this_06;
  XYZVisitor *this_07;
  PrepareVisitor *this_08;
  DumpReader *this_09;
  Molecule *pMVar3;
  int whichFrame;
  pointer ppRVar4;
  pointer ppSVar5;
  StuntDouble *pSVar6;
  RigidBody *this_10;
  MoleculeIterator miter;
  string xyzFileName;
  string dumpFileName;
  Vector3d newMolCom;
  Vector3d molCom;
  Vector<int,_3U> local_524;
  Mat3x3d hmat;
  Vector3d displacement;
  SimCreator creator;
  Vector<double,_3U> local_490;
  Vector<double,_3U> local_478;
  gengetopt_args_info args_info;
  Vector<double,_3U> local_248;
  ofstream xyzStream;
  
  dumpFileName._M_dataplus._M_p = (pointer)&dumpFileName.field_2;
  dumpFileName._M_string_length = 0;
  dumpFileName.field_2._M_local_buf[0] = '\0';
  xyzFileName._M_dataplus._M_p = (pointer)&xyzFileName.field_2;
  xyzFileName._M_string_length = 0;
  xyzFileName.field_2._M_local_buf[0] = '\0';
  iVar1 = cmdline_parser(argc,argv,&args_info);
  if (iVar1 == 0) {
    if (args_info.input_given == 0) {
      builtin_strncpy(painCave.errMsg,"No input file name was specified.\n",0x23);
      painCave.isFatal = 1;
      simError();
    }
    else {
      std::__cxx11::string::assign((char *)&dumpFileName);
    }
    if (args_info.output_given == 0) {
      std::__cxx11::string::_M_assign((string *)&xyzFileName);
      std::__cxx11::string::rfind((char *)&xyzFileName,0x212828);
      std::__cxx11::string::substr((ulong)&hmat,(ulong)&xyzFileName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xyzStream
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hmat,
                     ".xyz");
      std::__cxx11::string::operator=((string *)&xyzFileName,(string *)&xyzStream);
      std::__cxx11::string::~string((string *)&xyzStream);
      std::__cxx11::string::~string((string *)&hmat);
    }
    else {
      std::__cxx11::string::assign((char *)&xyzFileName);
    }
    creator.mdFileName_._M_dataplus._M_p = (pointer)&creator.mdFileName_.field_2;
    creator._vptr_SimCreator = (_func_int **)&PTR__SimCreator_00283940;
    creator.mdFileName_._M_string_length = 0;
    creator.mdFileName_.field_2._M_local_buf[0] = '\0';
    info = OpenMD::SimCreator::createSim(&creator,&dumpFileName,false);
    this_00 = (ForceManager *)operator_new(0xc80);
    OpenMD::ForceManager::ForceManager(this_00,info);
    this_01 = (CompositeVisitor *)operator_new(0x40);
    OpenMD::CompositeVisitor::CompositeVisitor(this_01);
    if (args_info.rigidbody_flag != 0) {
      pBVar2 = (BaseVisitor *)operator_new(0x30);
      OpenMD::RBCOMVisitor::RBCOMVisitor((RBCOMVisitor *)pBVar2,info);
      OpenMD::CompositeVisitor::addVisitor(this_01,pBVar2,900);
    }
    pBVar2 = (BaseVisitor *)operator_new(0x78);
    OpenMD::SSDAtomVisitor::SSDAtomVisitor((SSDAtomVisitor *)pBVar2,info);
    OpenMD::CompositeVisitor::addVisitor(this_01,pBVar2,800);
    pBVar2 = (BaseVisitor *)operator_new(0x78);
    OpenMD::GBtailVisitor::GBtailVisitor((GBtailVisitor *)pBVar2,info);
    OpenMD::CompositeVisitor::addVisitor(this_01,pBVar2,0x316);
    pBVar2 = (BaseVisitor *)operator_new(0x78);
    OpenMD::GBheadVisitor::GBheadVisitor((GBheadVisitor *)pBVar2,info);
    OpenMD::CompositeVisitor::addVisitor(this_01,pBVar2,0x315);
    pBVar2 = (BaseVisitor *)operator_new(0x38);
    OpenMD::DefaultAtomVisitor::DefaultAtomVisitor((DefaultAtomVisitor *)pBVar2,info);
    OpenMD::CompositeVisitor::addVisitor(this_01,pBVar2,700);
    if ((args_info.water_given == 0) && (args_info.watertype_flag != 0)) {
      this_02 = (WaterTypeVisitor *)operator_new(0x58);
      OpenMD::WaterTypeVisitor::WaterTypeVisitor(this_02);
      OpenMD::CompositeVisitor::addVisitor(this_01,(BaseVisitor *)this_02,600);
    }
    if (args_info.basetype_flag != 0) {
      this_03 = (AtomNameVisitor *)operator_new(0x38);
      OpenMD::AtomNameVisitor::AtomNameVisitor(this_03,info);
      OpenMD::CompositeVisitor::addVisitor(this_01,(BaseVisitor *)this_03,0x226);
    }
    if (args_info.zconstraint_flag != 0) {
      this_04 = (ZConsVisitor *)operator_new(0xe8);
      OpenMD::ZConsVisitor::ZConsVisitor(this_04,info);
      if ((this_04->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        (*(this_04->super_BaseVisitor)._vptr_BaseVisitor[1])(this_04);
      }
      else {
        OpenMD::CompositeVisitor::addVisitor(this_01,(BaseVisitor *)this_04,500);
      }
    }
    if (((args_info.repeatX_given != 0) || (args_info.repeatY_given != 0)) ||
       (args_info.repeatZ_given != 0)) {
      OpenMD::Vector<int,_3U>::Vector((Vector<int,_3U> *)&xyzStream);
      _xyzStream = args_info.repeatX_arg;
      this_05 = (ReplicateVisitor *)operator_new(0x58);
      OpenMD::Vector<int,_3U>::Vector(&local_524,(Vector<int,_3U> *)&xyzStream);
      OpenMD::ReplicateVisitor::ReplicateVisitor(this_05,info,(Vector3i *)&local_524);
      OpenMD::CompositeVisitor::addVisitor(this_01,(BaseVisitor *)this_05,300);
    }
    if (args_info.originsele_given == 0 || args_info.refsele_given == 0) {
      if (args_info.refsele_given != 0 || args_info.originsele_given != 0) {
        memcpy(&painCave,"The --refsele and --originsele arguments should appear together.\n",0x42);
        painCave.isFatal = 1;
        simError();
      }
    }
    else {
      this_06 = (LipidTransVisitor *)operator_new(0xcd0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&xyzStream,args_info.originsele_arg,(allocator<char> *)&molCom);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&hmat,args_info.refsele_arg,(allocator<char> *)&newMolCom);
      OpenMD::LipidTransVisitor::LipidTransVisitor
                (this_06,info,(string *)&xyzStream,(string *)&hmat);
      OpenMD::CompositeVisitor::addVisitor(this_01,(BaseVisitor *)this_06,0xfa);
      std::__cxx11::string::~string((string *)&hmat);
      std::__cxx11::string::~string((string *)&xyzStream);
    }
    if (args_info.selection_given == 0) {
      this_07 = (XYZVisitor *)operator_new(0x668);
      OpenMD::XYZVisitor::XYZVisitor(this_07,info);
    }
    else {
      this_07 = (XYZVisitor *)operator_new(0x668);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&xyzStream,args_info.selection_arg,(allocator<char> *)&hmat);
      OpenMD::XYZVisitor::XYZVisitor(this_07,info,(string *)&xyzStream);
      std::__cxx11::string::~string((string *)&xyzStream);
    }
    if (args_info.velocities_flag != 0) {
      this_07->doVelocities_ = true;
    }
    if (args_info.forces_flag != 0) {
      this_07->doForces_ = true;
    }
    if (args_info.vectors_flag != 0) {
      this_07->doVectors_ = true;
    }
    if (args_info.charges_flag != 0) {
      this_07->doCharges_ = true;
    }
    if (args_info.efield_flag != 0) {
      this_07->doElectricFields_ = true;
    }
    if (args_info.globalID_flag != 0) {
      this_07->doGlobalIDs_ = true;
    }
    OpenMD::CompositeVisitor::addVisitor(this_01,&this_07->super_BaseVisitor,200);
    this_08 = (PrepareVisitor *)operator_new(0x28);
    OpenMD::PrepareVisitor::PrepareVisitor(this_08);
    this_09 = (DumpReader *)operator_new(0x1258);
    OpenMD::DumpReader::DumpReader(this_09,info,&dumpFileName);
    iVar1 = OpenMD::DumpReader::getNFrames(this_09);
    std::ofstream::ofstream(&xyzStream,xyzFileName._M_dataplus._M_p,_S_out);
    miter._M_node = (_Base_ptr)0x0;
    OpenMD::Vector<double,_3U>::Vector(&molCom.super_Vector<double,_3U>);
    OpenMD::Vector<double,_3U>::Vector(&newMolCom.super_Vector<double,_3U>);
    OpenMD::Vector<double,_3U>::Vector(&displacement.super_Vector<double,_3U>);
    OpenMD::SquareMatrix<double,_3>::SquareMatrix(&hmat.super_SquareMatrix<double,_3>);
    for (whichFrame = 0; whichFrame < iVar1; whichFrame = whichFrame + args_info.frame_arg) {
      OpenMD::DumpReader::readFrame(this_09,whichFrame);
      if (args_info.forces_flag != 0) {
        (*this_00->_vptr_ForceManager[2])();
      }
      if (args_info.periodicBox_flag != 0) {
        this = info->sman_->currentSnapshot_;
        pMVar3 = OpenMD::SimInfo::beginMolecule(info,&miter);
        while (pMVar3 != (Molecule *)0x0) {
          OpenMD::Molecule::getCom((Vector3d *)&local_248,pMVar3);
          OpenMD::Vector<double,_3U>::operator=(&molCom.super_Vector<double,_3U>,&local_248);
          OpenMD::Vector<double,_3U>::operator=
                    (&newMolCom.super_Vector<double,_3U>,&molCom.super_Vector<double,_3U>);
          OpenMD::Snapshot::wrapVector(this,&newMolCom);
          OpenMD::operator-(&local_248,&newMolCom.super_Vector<double,_3U>,
                            &molCom.super_Vector<double,_3U>);
          OpenMD::Vector3<double>::operator=(&displacement,&local_248);
          ppSVar5 = (pMVar3->integrableObjects_).
                    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (ppSVar5 !=
              (pMVar3->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) goto LAB_00120008;
          pSVar6 = (StuntDouble *)0x0;
          while (pSVar6 != (StuntDouble *)0x0) {
            OpenMD::StuntDouble::getPos((Vector3d *)&local_490,pSVar6);
            OpenMD::operator+(&local_478,&local_490,&displacement.super_Vector<double,_3U>);
            OpenMD::Vector<double,_3U>::Vector(&local_248,&local_478);
            OpenMD::StuntDouble::setPos(pSVar6,(Vector3d *)&local_248);
            ppSVar5 = ppSVar5 + 1;
            pSVar6 = (StuntDouble *)0x0;
            if (ppSVar5 !=
                (pMVar3->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
LAB_00120008:
              pSVar6 = *ppSVar5;
            }
          }
          pMVar3 = OpenMD::SimInfo::nextMolecule(info,&miter);
        }
      }
      pMVar3 = OpenMD::SimInfo::beginMolecule(info,&miter);
      while (pMVar3 != (Molecule *)0x0) {
        ppRVar4 = (pMVar3->rigidBodies_).
                  super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (ppRVar4 !=
            (pMVar3->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_finish) goto LAB_00120078;
        this_10 = (RigidBody *)0x0;
        while (this_10 != (RigidBody *)0x0) {
          OpenMD::RigidBody::updateAtoms(this_10);
          if (args_info.velocities_flag != 0) {
            OpenMD::RigidBody::updateAtomVel(this_10);
          }
          ppRVar4 = ppRVar4 + 1;
          this_10 = (RigidBody *)0x0;
          if (ppRVar4 !=
              (pMVar3->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
LAB_00120078:
            this_10 = *ppRVar4;
          }
        }
        pMVar3 = OpenMD::SimInfo::nextMolecule(info,&miter);
      }
      pMVar3 = OpenMD::SimInfo::beginMolecule(info,&miter);
      while (pMVar3 != (Molecule *)0x0) {
        ppSVar5 = (pMVar3->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (ppSVar5 !=
            (pMVar3->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_001200d8;
        pSVar6 = (StuntDouble *)0x0;
        while (pSVar6 != (StuntDouble *)0x0) {
          (*pSVar6->_vptr_StuntDouble[9])(pSVar6,this_08);
          ppSVar5 = ppSVar5 + 1;
          pSVar6 = (StuntDouble *)0x0;
          if (ppSVar5 !=
              (pMVar3->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
LAB_001200d8:
            pSVar6 = *ppSVar5;
          }
        }
        pMVar3 = OpenMD::SimInfo::nextMolecule(info,&miter);
      }
      (*(this_01->super_BaseVisitor)._vptr_BaseVisitor[9])();
      pMVar3 = OpenMD::SimInfo::beginMolecule(info,&miter);
      while (pMVar3 != (Molecule *)0x0) {
        ppSVar5 = (pMVar3->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (ppSVar5 !=
            (pMVar3->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_00120145;
        pSVar6 = (StuntDouble *)0x0;
        while (pSVar6 != (StuntDouble *)0x0) {
          (*pSVar6->_vptr_StuntDouble[9])(pSVar6,this_01);
          ppSVar5 = ppSVar5 + 1;
          pSVar6 = (StuntDouble *)0x0;
          if (ppSVar5 !=
              (pMVar3->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
LAB_00120145:
            pSVar6 = *ppSVar5;
          }
        }
        pMVar3 = OpenMD::SimInfo::nextMolecule(info,&miter);
      }
      OpenMD::XYZVisitor::writeFrame(this_07,(ostream *)&xyzStream);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this_07->frame);
    }
    std::ofstream::close();
    (*this_00->_vptr_ForceManager[1])();
    (*(this_01->super_BaseVisitor)._vptr_BaseVisitor[1])();
    (*(this_08->super_BaseVisitor)._vptr_BaseVisitor[1])(this_08);
    OpenMD::DumpReader::~DumpReader(this_09);
    operator_delete(this_09,0x1258);
    if (info != (SimInfo *)0x0) {
      (*info->_vptr_SimInfo[1])();
    }
    std::ofstream::~ofstream(&xyzStream);
    OpenMD::SimCreator::~SimCreator(&creator);
    std::__cxx11::string::~string((string *)&xyzFileName);
    std::__cxx11::string::~string((string *)&dumpFileName);
    return 0;
  }
  exit(1);
}

Assistant:

int main(int argc, char* argv[]) {
  gengetopt_args_info args_info;
  string dumpFileName;
  string xyzFileName;

  bool printVel(false);
  bool printFrc(false);
  bool printVec(false);
  bool printChrg(false);
  bool printField(false);
  bool printGlobalID(false);

  // parse the command line option
  if (cmdline_parser(argc, argv, &args_info) != 0) { exit(1); }

  // get the dumpfile name and meta-data file name
  if (args_info.input_given) {
    dumpFileName = args_info.input_arg;
  } else {
    strcpy(painCave.errMsg, "No input file name was specified.\n");
    painCave.isFatal = 1;
    simError();
  }

  if (args_info.output_given) {
    xyzFileName = args_info.output_arg;
  } else {
    xyzFileName = dumpFileName;
    xyzFileName = xyzFileName.substr(0, xyzFileName.rfind(".")) + ".xyz";
  }

  // parse md file and set up the system
  SimCreator creator;
  SimInfo* info          = creator.createSim(dumpFileName, false);
  ForceManager* forceMan = new ForceManager(info);

  // create visitor list
  CompositeVisitor* compositeVisitor = new CompositeVisitor();

  // create RigidBody Visitor
  if (args_info.rigidbody_flag) {
    RBCOMVisitor* rbCOMVisitor = new RBCOMVisitor(info);
    compositeVisitor->addVisitor(rbCOMVisitor, 900);
  }

  // create SSD atom visitor
  SSDAtomVisitor* ssdVisitor = new SSDAtomVisitor(info);
  compositeVisitor->addVisitor(ssdVisitor, 800);

  // create GBtail atom visitor
  GBtailVisitor* gbtVisitor = new GBtailVisitor(info);
  compositeVisitor->addVisitor(gbtVisitor, 790);

  // create GBhead atom visitor
  GBheadVisitor* gbhVisitor = new GBheadVisitor(info);
  compositeVisitor->addVisitor(gbhVisitor, 789);

  // create default atom visitor
  DefaultAtomVisitor* defaultAtomVisitor = new DefaultAtomVisitor(info);
  compositeVisitor->addVisitor(defaultAtomVisitor, 700);

  // if we gave the -w option, we want to skip the waters:
  if (!args_info.water_given) {
    // create waterType visitor
    if (args_info.watertype_flag) {
      WaterTypeVisitor* waterTypeVisitor = new WaterTypeVisitor;
      compositeVisitor->addVisitor(waterTypeVisitor, 600);
    }
  }

  if (args_info.basetype_flag) {
    AtomNameVisitor* atomNameVisitor = new AtomNameVisitor(info);
    compositeVisitor->addVisitor(atomNameVisitor, 550);
    // When debugging visitors, you may find this helpful:
    //    cout << compositeVisitor->toString();
  }

  // create ZconsVisitor
  if (args_info.zconstraint_flag) {
    ZConsVisitor* zconsVisitor = new ZConsVisitor(info);

    if (zconsVisitor->haveZconsMol()) {
      compositeVisitor->addVisitor(zconsVisitor, 500);
    } else {
      delete zconsVisitor;
    }
  }

  // create wrapping visitor

  // if(args_info.periodicBox_flag){
  //  WrappingVisitor* wrappingVisitor = new WrappingVisitor(info);
  //  compositeVisitor->addVisitor(wrappingVisitor, 400);
  //}

  // create replicate visitor
  if (args_info.repeatX_given > 0 || args_info.repeatY_given > 0 ||
      args_info.repeatZ_given > 0) {
    Vector3i replicateOpt(args_info.repeatX_arg, args_info.repeatY_arg,
                          args_info.repeatZ_arg);
    ReplicateVisitor* replicateVisitor =
        new ReplicateVisitor(info, replicateOpt);
    compositeVisitor->addVisitor(replicateVisitor, 300);
  }

  // create rotation visitor
  if (args_info.refsele_given && args_info.originsele_given) {
    compositeVisitor->addVisitor(
        new LipidTransVisitor(info, args_info.originsele_arg,
                              args_info.refsele_arg),
        250);
  } else if (args_info.refsele_given || args_info.originsele_given) {
    strcpy(
        painCave.errMsg,
        "The --refsele and --originsele arguments should appear together.\n");
    painCave.isFatal = 1;
    simError();
  }

  // create xyzVisitor
  XYZVisitor* xyzVisitor;

  if (args_info.selection_given) {
    xyzVisitor = new XYZVisitor(info, args_info.selection_arg);
  } else {
    xyzVisitor = new XYZVisitor(info);
  }

  if (args_info.velocities_flag) {
    printVel = true;
    xyzVisitor->doVelocities(printVel);
  }
  if (args_info.forces_flag) {
    printFrc = true;
    xyzVisitor->doForces(printFrc);
  }
  if (args_info.vectors_flag) {
    printVec = true;
    xyzVisitor->doVectors(printVec);
  }
  if (args_info.charges_flag) {
    printChrg = true;
    xyzVisitor->doCharges(printChrg);
  }
  if (args_info.efield_flag) {
    printField = true;
    xyzVisitor->doElectricFields(printField);
  }
  if (args_info.globalID_flag) {
    printGlobalID = true;
    xyzVisitor->doGlobalIDs(printGlobalID);
  }

  compositeVisitor->addVisitor(xyzVisitor, 200);

  // create prepareVisitor
  PrepareVisitor* prepareVisitor = new PrepareVisitor();

  // open dump file
  DumpReader* dumpReader = new DumpReader(info, dumpFileName);
  int nframes            = dumpReader->getNFrames();

  ofstream xyzStream(xyzFileName.c_str());

  SimInfo::MoleculeIterator miter;
  Molecule::IntegrableObjectIterator iiter;
  Molecule::RigidBodyIterator rbIter;
  Molecule* mol;
  StuntDouble* sd;
  RigidBody* rb;
  Vector3d molCom;
  Vector3d newMolCom;
  Vector3d displacement;
  Mat3x3d hmat;
  Snapshot* currentSnapshot;

  for (int i = 0; i < nframes; i += args_info.frame_arg) {
    dumpReader->readFrame(i);

    if (printFrc) forceMan->calcForces();

    // wrapping the molecule
    if (args_info.periodicBox_flag) {
      currentSnapshot = info->getSnapshotManager()->getCurrentSnapshot();
      for (mol = info->beginMolecule(miter); mol != NULL;
           mol = info->nextMolecule(miter)) {
        molCom    = mol->getCom();
        newMolCom = molCom;
        currentSnapshot->wrapVector(newMolCom);
        displacement = newMolCom - molCom;

        for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
             sd = mol->nextIntegrableObject(iiter)) {
          sd->setPos(sd->getPos() + displacement);
        }
      }
    }

    // update atoms of rigidbody
    for (mol = info->beginMolecule(miter); mol != NULL;
         mol = info->nextMolecule(miter)) {
      // change the positions of atoms which belong to the rigidbodies
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        rb->updateAtoms();
        if (printVel) rb->updateAtomVel();
      }
    }

    // prepare visit
    for (mol = info->beginMolecule(miter); mol != NULL;
         mol = info->nextMolecule(miter)) {
      for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
           sd = mol->nextIntegrableObject(iiter)) {
        sd->accept(prepareVisitor);
      }
    }

    // update visitor
    compositeVisitor->update();

    // visit stuntdouble
    for (mol = info->beginMolecule(miter); mol != NULL;
         mol = info->nextMolecule(miter)) {
      for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
           sd = mol->nextIntegrableObject(iiter)) {
        sd->accept(compositeVisitor);
      }
    }

    xyzVisitor->writeFrame(xyzStream);
    xyzVisitor->clear();

  }  // end for (int i = 0; i < nframes; i += args_info.frame_arg)

  xyzStream.close();

  delete forceMan;
  delete compositeVisitor;
  delete prepareVisitor;
  delete dumpReader;

  delete info;
}